

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::State_const&>::operator==
          (result *__return_storage_ptr__,expression_lhs<(anonymous_namespace)::State_const&> *this,
          State *rhs)

{
  char *pcVar1;
  char *pcVar2;
  State SVar3;
  State SVar4;
  undefined8 uVar5;
  result *extraout_RAX;
  result *extraout_RAX_00;
  result *prVar6;
  char *pcVar7;
  State *in_R8;
  result *local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  result *local_98;
  undefined8 local_90;
  result local_88;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  bool local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  SVar4 = *(State *)this;
  SVar3 = *rhs;
  local_d8 = (result *)local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"==","");
  local_98 = &local_88;
  if (local_d8 == (result *)local_c8) {
    local_88.decomposition._M_dataplus._M_p = (pointer)local_c8._8_8_;
  }
  else {
    local_98 = local_d8;
  }
  local_88._1_7_ = local_c8._1_7_;
  local_88.passed = local_c8[0];
  local_90 = local_d0;
  local_d0 = 0;
  local_c8[0] = false;
  local_d8 = (result *)local_c8;
  to_string<(anonymous_namespace)::State,(anonymous_namespace)::State>
            ((string *)(local_c8 + 0x10),(lest *)this,(State *)&local_98,(string *)rhs,in_R8);
  uVar5 = local_b0._M_allocated_capacity;
  pcVar1 = local_88.decomposition.field_2._M_local_buf + 8;
  pcVar2 = local_b0._M_local_buf + 8;
  if ((char *)local_c8._16_8_ == pcVar2) {
    uStack_60 = uStack_a0;
    uStack_5c = uStack_9c;
    local_c8._16_8_ = pcVar1;
  }
  local_88.decomposition.field_2._12_4_ = local_b0._12_4_;
  local_88.decomposition.field_2._8_4_ = local_b0._8_4_;
  local_88.decomposition.field_2._M_allocated_capacity = local_b0._M_allocated_capacity;
  local_b0._M_allocated_capacity = 0;
  local_b0._8_4_ = local_b0._8_4_ & 0xffffff00;
  pcVar7 = (char *)(local_c8._16_8_ + uVar5);
  local_88.decomposition._M_string_length = local_c8._16_8_;
  local_c8._16_8_ = pcVar2;
  local_58 = SVar4 == SVar3;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_88.decomposition._M_string_length,pcVar7);
  __return_storage_ptr__->passed = local_58;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_50,local_48 + (long)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((char *)local_88.decomposition._M_string_length != pcVar1) {
    operator_delete((void *)local_88.decomposition._M_string_length,
                    local_88.decomposition.field_2._8_8_ + 1);
  }
  if ((char *)local_c8._16_8_ != pcVar2) {
    operator_delete((void *)local_c8._16_8_,CONCAT44(local_b0._12_4_,local_b0._8_4_) + 1);
  }
  prVar6 = &local_88;
  if (local_98 != prVar6) {
    operator_delete(local_98,local_88._0_8_ + 1);
    prVar6 = extraout_RAX;
  }
  if (local_d8 != (result *)local_c8) {
    operator_delete(local_d8,CONCAT71(local_c8._1_7_,local_c8[0]) + 1);
    prVar6 = extraout_RAX_00;
  }
  return prVar6;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }